

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZRefPatternTools.cpp
# Opt level: O1

TPZAutoPointer<TPZRefPattern> __thiscall
TPZRefPatternTools::PerfectMatchRefPattern
          (TPZRefPatternTools *this,TPZGeoEl *gel,TPZVec<int> *sidestorefine)

{
  _List_node_base **pp_Var1;
  TPZVec<TPZVec<std::pair<int,_TPZTransform<double>_>_>_> *pTVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  TPZGeoEl *pTVar6;
  _List_node_base *p_Var7;
  undefined8 *puVar8;
  TPZRefPattern *pTVar9;
  _List_node_base *p_Var10;
  _List_node_base *p_Var11;
  uint uVar12;
  ulong uVar13;
  TPZAutoPointer<TPZRefPattern> refpat;
  list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_> patlist;
  list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_> perfectmatch;
  TPZAutoPointer<TPZRefPattern> local_70;
  _List_base<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
  local_68;
  TPZReference *local_50;
  _List_base<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
  local_48;
  
  if (gel == (TPZGeoEl *)0x0) {
    puVar8 = (undefined8 *)operator_new(0x10);
    *puVar8 = 0;
    *(undefined4 *)(puVar8 + 1) = 0;
    LOCK();
    *(undefined4 *)(puVar8 + 1) = 1;
    UNLOCK();
    *(undefined8 **)this = puVar8;
  }
  else {
    local_68._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_68;
    local_68._M_impl._M_node._M_size = 0;
    local_48._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_48;
    local_48._M_impl._M_node._M_size = 0;
    local_68._M_impl._M_node.super__List_node_base._M_prev =
         local_68._M_impl._M_node.super__List_node_base._M_next;
    local_50 = (TPZReference *)this;
    local_48._M_impl._M_node.super__List_node_base._M_prev =
         local_48._M_impl._M_node.super__List_node_base._M_next;
    GetCompatibleRefPatterns
              (gel,(list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
                    *)local_68._M_impl._M_node.super__List_node_base._M_next);
    for (p_Var11 = local_68._M_impl._M_node.super__List_node_base._M_next;
        p_Var11 != (_List_node_base *)&local_68;
        p_Var11 = (((_List_base<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
                     *)&p_Var11->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
      p_Var10 = p_Var11[1]._M_next;
      if ((p_Var10 != (_List_node_base *)0x0) && (p_Var10->_M_next != (_List_node_base *)0x0)) {
        pTVar6 = TPZRefPattern::Element((TPZRefPattern *)p_Var10->_M_next,0);
        uVar3 = (**(code **)(*(long *)pTVar6 + 0x98))(pTVar6);
        uVar13 = (ulong)uVar3;
        iVar4 = (**(code **)(*(long *)pTVar6 + 0xf0))(pTVar6);
        iVar5 = (**(code **)(*(long *)pTVar6 + 0x210))(pTVar6);
        uVar12 = iVar4 - (uint)(iVar5 == 3);
        if ((int)uVar3 < (int)uVar12) {
          uVar13 = (ulong)(int)uVar3;
          do {
            iVar4 = sidestorefine->fStore[uVar13];
            iVar5 = TPZRefPattern::NSideNodes
                              ((TPZRefPattern *)(p_Var11[1]._M_next)->_M_next,(int)uVar13);
            if (iVar4 != iVar5) goto LAB_010427f7;
            uVar13 = uVar13 + 1;
          } while ((long)(int)uVar12 != uVar13);
          uVar13 = (ulong)uVar12;
        }
LAB_010427f7:
        if ((uint)uVar13 == uVar12) {
          p_Var7 = (_List_node_base *)operator_new(0x18);
          p_Var10 = p_Var11[1]._M_next;
          p_Var7[1]._M_next = p_Var10;
          LOCK();
          pp_Var1 = &p_Var10->_M_prev;
          *(int *)pp_Var1 = *(int *)pp_Var1 + 1;
          UNLOCK();
          std::__detail::_List_node_base::_M_hook(p_Var7);
          local_48._M_impl._M_node._M_size = local_48._M_impl._M_node._M_size + 1;
        }
      }
    }
    std::__cxx11::
    _List_base<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>::
    _M_clear(&local_68);
    this = (TPZRefPatternTools *)local_50;
    local_68._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_68;
    local_68._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_68;
    local_68._M_impl._M_node._M_size = 0;
    if (local_48._M_impl._M_node._M_size == 0) {
      pTVar9 = (TPZRefPattern *)operator_new(0x10);
      (pTVar9->super_TPZSavable)._vptr_TPZSavable = (_func_int **)0x0;
      *(undefined4 *)&(pTVar9->fSubElSideInfo)._vptr_TPZVec = 0;
      LOCK();
      *(undefined4 *)&(pTVar9->fSubElSideInfo)._vptr_TPZVec = 1;
      UNLOCK();
      ((TPZReference *)this)->fPointer = pTVar9;
    }
    else {
      p_Var11 = local_48._M_impl._M_node.super__List_node_base._M_next;
      if (local_48._M_impl._M_node._M_size != 1) {
        if (local_48._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_48)
        {
          iVar4 = 0x1e;
          do {
            local_70.fRef = (TPZReference *)p_Var11[1]._M_next;
            LOCK();
            *(int *)&((_List_node_base *)local_70.fRef)->_M_prev =
                 *(int *)&((_List_node_base *)local_70.fRef)->_M_prev + 1;
            UNLOCK();
            iVar5 = TPZRefPattern::NSubElements
                              ((TPZRefPattern *)((_List_node_base *)local_70.fRef)->_M_next);
            if (iVar5 < iVar4) {
              iVar4 = TPZRefPattern::NSubElements((local_70.fRef)->fPointer);
              std::__cxx11::
              _List_base<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
              ::_M_clear(&local_68);
              local_68._M_impl._M_node._M_size = 0;
              local_68._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_68;
              local_68._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_68;
              p_Var10 = (_List_node_base *)operator_new(0x18);
LAB_01042941:
              p_Var7 = p_Var11[1]._M_next;
              p_Var10[1]._M_next = p_Var7;
              LOCK();
              pp_Var1 = &p_Var7->_M_prev;
              *(int *)pp_Var1 = *(int *)pp_Var1 + 1;
              UNLOCK();
              std::__detail::_List_node_base::_M_hook(p_Var10);
              local_68._M_impl._M_node._M_size = local_68._M_impl._M_node._M_size + 1;
            }
            else {
              iVar5 = TPZRefPattern::NSubElements((local_70.fRef)->fPointer);
              if (iVar5 == iVar4) {
                p_Var10 = (_List_node_base *)operator_new(0x18);
                goto LAB_01042941;
              }
            }
            TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer(&local_70);
            p_Var11 = (((_List_impl *)&p_Var11->_M_next)->_M_node).super__List_node_base._M_next;
          } while (p_Var11 != (_List_node_base *)&local_48);
        }
        p_Var11 = local_68._M_impl._M_node.super__List_node_base._M_next;
        p_Var10 = (_List_node_base *)&local_68;
        if (local_68._M_impl._M_node._M_size != 1) {
          while (p_Var10 = p_Var10->_M_next, p_Var10 != (_List_node_base *)&local_68) {
            TPZGeoMesh::Print((TPZGeoMesh *)((p_Var10[1]._M_next)->_M_next + 0xb),
                              (ostream *)&std::cout);
          }
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Refine/TPZRefPatternTools.cpp"
                     ,0xf8);
        }
      }
      pTVar9 = (TPZRefPattern *)p_Var11[1]._M_next;
      ((TPZReference *)this)->fPointer = pTVar9;
      LOCK();
      pTVar2 = &pTVar9->fSubElSideInfo;
      *(int *)&pTVar2->_vptr_TPZVec = *(int *)&pTVar2->_vptr_TPZVec + 1;
      UNLOCK();
    }
    std::__cxx11::
    _List_base<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>::
    _M_clear(&local_48);
    std::__cxx11::
    _List_base<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>::
    _M_clear(&local_68);
  }
  return (TPZAutoPointer<TPZRefPattern>)(TPZReference *)this;
}

Assistant:

TPZAutoPointer<TPZRefPattern> TPZRefPatternTools::PerfectMatchRefPattern(TPZGeoEl *gel,
                                                                         TPZVec<int> &sidestorefine)
{
	if(!gel)
	{
		return NULL;
	}
	
	std::list<TPZAutoPointer<TPZRefPattern> > patlist, perfectmatch;
	TPZRefPatternTools::GetCompatibleRefPatterns(gel, patlist);
	
    // totototo
    //std::cout << "gel index " << gel->Index() << " sides " <<  sidestorefine << std::endl;
	std::list<TPZAutoPointer<TPZRefPattern> >::iterator it;
	for(it = patlist.begin(); it != patlist.end(); it++)
	{
		if( !(*it) )
		{
			continue;	
		}
		TPZGeoEl * gelTemp = (*it)->Element(0);
		int ncorners = gelTemp->NCornerNodes();
		int nsides = gelTemp->NSides();
		if(gelTemp->Dimension() == 3)
		{
			nsides--;
		}

		int is;
		for(is = ncorners; is < nsides; is++)
		{
			if( sidestorefine[is] != (*it)->NSideNodes(is) )
			{
				break;	
			}
		}
		if(is == nsides)
		{
            perfectmatch.push_back(*it);
		}
	}
    //std::cout << "perfect match size " << perfectmatch.size() << std::endl;
    
    patlist.clear();
    if (perfectmatch.size() == 1) {
        return *perfectmatch.begin();
    } else if(perfectmatch.size() > 1)
    {
        // return the refpattern with the least number of elements
        
        int minsubel = 30;
        for (auto it=perfectmatch.begin(); it!= perfectmatch.end(); it++) {
            TPZAutoPointer<TPZRefPattern> refpat = *it;
            if (refpat->NSubElements() < minsubel) {
                minsubel = refpat->NSubElements();
                patlist.clear();
                patlist.push_back(*it);
            }
            else if(refpat->NSubElements() == minsubel)
            {
                patlist.push_back(*it);
            }
        }
        if (patlist.size() != 1) {
            for (auto it2=patlist.begin(); it2 != patlist.end(); it2++) {
                (*it2)->fRefPatternMesh.Print();
            }
            DebugStop();
        }
        return *patlist.begin();
    }
    else
    {
        return NULL;
    }
}